

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

void nn_ws_handshake_init(nn_ws_handshake *self,int src,nn_fsm *owner)

{
  nn_fsm_init(&self->fsm,nn_ws_handshake_handler,nn_ws_handshake_shutdown,src,self,owner);
  self->state = 1;
  nn_timer_init(&self->timer,2,&self->fsm);
  nn_fsm_event_init(&self->done);
  self->timeout = 5000;
  self->usock = (nn_usock *)0x0;
  (self->usock_owner).src = -1;
  (self->usock_owner).fsm = (nn_fsm *)0x0;
  self->pipebase = (nn_pipebase *)0x0;
  return;
}

Assistant:

void nn_ws_handshake_init (struct nn_ws_handshake *self, int src,
    struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_ws_handshake_handler, nn_ws_handshake_shutdown,
        src, self, owner);
    self->state = NN_WS_HANDSHAKE_STATE_IDLE;
    nn_timer_init (&self->timer, NN_WS_HANDSHAKE_SRC_TIMER, &self->fsm);
    nn_fsm_event_init (&self->done);
    self->timeout = NN_WS_HANDSHAKE_TIMEOUT;
    self->usock = NULL;
    self->usock_owner.src = -1;
    self->usock_owner.fsm = NULL;
    self->pipebase = NULL;
}